

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QAbstractEventDispatcher::TimerInfo>::relocate
          (QArrayDataPointer<QAbstractEventDispatcher::TimerInfo> *this,qsizetype offset,
          TimerInfo **data)

{
  bool bVar1;
  TimerInfo *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  TimerInfo *res;
  
  first = (TimerInfo *)(*(long *)(in_RDI + 8) + in_RSI * 0xc);
  QtPrivate::q_relocate_overlap_n<QAbstractEventDispatcher::TimerInfo,long_long>
            (first,in_RDI,(TimerInfo *)0x3327f4);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QAbstractEventDispatcher::TimerInfo>,QAbstractEventDispatcher::TimerInfo_const*>
                        (data,(QArrayDataPointer<QAbstractEventDispatcher::TimerInfo> *)res), bVar1)
     ) {
    *in_RDX = in_RSI * 0xc + *in_RDX;
  }
  *(TimerInfo **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }